

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

byte_string_view __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
as_byte_string_view(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this
                   )

{
  json_storage_kind jVar1;
  uint8_t *data;
  size_t sVar2;
  string *s;
  size_t extraout_RDX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RSI;
  byte_string_view *in_RDI;
  byte_string_view bVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff90;
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffe8;
  
  jVar1 = storage_kind(in_RSI);
  if (jVar1 == json_const_reference) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffff90);
    json_const_reference_storage::value((json_const_reference_storage *)0x1e82d0);
    bVar3 = as_byte_string_view(in_stack_ffffffffffffffe8);
    sVar2 = bVar3.size_;
  }
  else if (jVar1 == json_reference) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffff90);
    json_reference_storage::value((json_reference_storage *)0x1e82f4);
    bVar3 = as_byte_string_view(in_stack_ffffffffffffffe8);
    sVar2 = bVar3.size_;
  }
  else {
    if (jVar1 != byte_str) {
      s = (string *)__cxa_allocate_exception(0x18);
      this_00 = (json_runtime_error<std::domain_error,_void> *)&stack0xffffffffffffffcf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,s);
      __cxa_throw(s,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    }
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
              (in_stack_ffffffffffffff90);
    data = byte_string_storage::data((byte_string_storage *)0x1e8290);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
              (in_stack_ffffffffffffff90);
    sVar2 = byte_string_storage::length((byte_string_storage *)0x1e82a7);
    byte_string_view::byte_string_view(in_RDI,data,sVar2);
    sVar2 = extraout_RDX;
  }
  bVar3.size_ = sVar2;
  bVar3.data_ = (uint8_t *)in_RDI;
  return bVar3;
}

Assistant:

byte_string_view as_byte_string_view() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return byte_string_view(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string_view();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string_view();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }